

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::~cmLocalGenerator(cmLocalGenerator *this)

{
  ~cmLocalGenerator(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

cmLocalGenerator::~cmLocalGenerator() = default;